

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig config;
  int iVar1;
  uint uVar2;
  GLFWbool GVar3;
  undefined8 *puVar4;
  XVisualInfo *vis;
  undefined1 local_a0 [4];
  int count;
  XVisualInfo vi;
  _GLFWfbconfig *u;
  EGLConfig n;
  int local_48;
  int usableCount;
  int nativeCount;
  int i;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  EGLConfig *nativeConfigs;
  EGLConfig *result_local;
  _GLFWfbconfig *desired_local;
  _GLFWctxconfig *ctxconfig_local;
  
  nativeConfigs = result;
  result_local = (EGLConfig *)desired;
  desired_local = (_GLFWfbconfig *)ctxconfig;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_48);
  if (local_48 == 0) {
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
    ctxconfig_local._4_4_ = 0;
  }
  else {
    usableConfigs = (_GLFWfbconfig *)calloc((long)local_48,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)usableConfigs,local_48,&local_48);
    closest = (_GLFWfbconfig *)calloc((long)local_48,0x48);
    n._4_4_ = 0;
    for (usableCount = 0; usableCount < local_48; usableCount = usableCount + 1) {
      config = *(EGLConfig *)(&usableConfigs->redBits + (long)usableCount * 2);
      vi._56_8_ = closest + (int)n._4_4_;
      iVar1 = getEGLConfigAttrib(config,0x303f);
      if ((iVar1 == 0x308e) && (uVar2 = getEGLConfigAttrib(config,0x3033), (uVar2 & 4) != 0)) {
        memset(local_a0,0,0x40);
        iVar1 = getEGLConfigAttrib(config,0x302e);
        vi.visual = (Visual *)(long)iVar1;
        if (vi.visual != (Visual *)0x0) {
          if ((*(int *)((long)result_local + 0x3c) != 0) &&
             (puVar4 = (undefined8 *)XGetVisualInfo(_glfw.x11.display,1,local_a0,(long)&vis + 4),
             puVar4 != (undefined8 *)0x0)) {
            GVar3 = _glfwIsVisualTransparentX11((Visual *)*puVar4);
            *(GLFWbool *)(vi._56_8_ + 0x3c) = GVar3;
            XFree(puVar4);
          }
          if (desired_local->redBits == 0x30002) {
            if (desired_local->blueBits == 1) {
              uVar2 = getEGLConfigAttrib(config,0x3040);
              uVar2 = uVar2 & 1;
            }
            else {
              uVar2 = getEGLConfigAttrib(config,0x3040);
              uVar2 = uVar2 & 4;
            }
joined_r0x001334a5:
            if (uVar2 == 0) goto LAB_00133570;
          }
          else if (desired_local->redBits == 0x30001) {
            uVar2 = getEGLConfigAttrib(config,0x3040);
            uVar2 = uVar2 & 8;
            goto joined_r0x001334a5;
          }
          iVar1 = getEGLConfigAttrib(config,0x3024);
          *(int *)vi._56_8_ = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3023);
          *(int *)(vi._56_8_ + 4) = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3022);
          *(int *)(vi._56_8_ + 8) = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3021);
          *(int *)(vi._56_8_ + 0xc) = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3025);
          *(int *)(vi._56_8_ + 0x10) = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3026);
          *(int *)(vi._56_8_ + 0x14) = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3031);
          *(int *)(vi._56_8_ + 0x30) = iVar1;
          *(undefined4 *)(vi._56_8_ + 0x38) = 1;
          *(EGLConfig *)(vi._56_8_ + 0x40) = config;
          n._4_4_ = n._4_4_ + 1;
        }
      }
LAB_00133570:
    }
    _nativeCount = _glfwChooseFBConfig((_GLFWfbconfig *)result_local,closest,n._4_4_);
    if (_nativeCount != (_GLFWfbconfig *)0x0) {
      *nativeConfigs = (EGLConfig)_nativeCount->handle;
    }
    free(usableConfigs);
    free(closest);
    ctxconfig_local._4_4_ = (uint)(_nativeCount != (_GLFWfbconfig *)0x0);
  }
  return ctxconfig_local._4_4_;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        XVisualInfo vi = {0};

        // Only consider EGLConfigs with associated Visuals
        vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
        if (!vi.visualid)
            continue;

        if (desired->transparent)
        {
            int count;
            XVisualInfo* vis = XGetVisualInfo(_glfw.x11.display,
                                              VisualIDMask, &vi,
                                              &count);
            if (vis)
            {
                u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                XFree(vis);
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}